

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextGLImpl::BuildTLAS(DeviceContextGLImpl *this,BuildTLASAttribs *Attribs)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  BuildTLASAttribs *Attribs_local;
  DeviceContextGLImpl *this_local;
  
  msg.field_2._8_8_ = Attribs;
  FormatString<char[37]>((string *)local_38,(char (*) [37])"BuildTLAS is not supported in OpenGL");
  Message = (Char *)std::__cxx11::string::c_str();
  DebugAssertionFailed
            (Message,"BuildTLAS",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
             ,0x7ea);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void DeviceContextGLImpl::BuildTLAS(const BuildTLASAttribs& Attribs)
{
    UNSUPPORTED("BuildTLAS is not supported in OpenGL");
}